

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString * __thiscall SimpleString::operator+=(SimpleString *this,char *rhs)

{
  size_t sVar1;
  size_t sVar2;
  size_t bufferSize;
  char *pcVar3;
  char *tbuffer;
  size_t sizeOfNewString;
  size_t additionalStringSize;
  size_t originalSize;
  char *rhs_local;
  SimpleString *this_local;
  
  sVar1 = size(this);
  sVar2 = StrLen(rhs);
  bufferSize = sVar1 + sVar2 + 1;
  pcVar3 = getBuffer(this);
  pcVar3 = copyToNewBuffer(pcVar3,bufferSize);
  StrNCpy(pcVar3 + sVar1,rhs,sVar2 + 1);
  setInternalBufferTo(this,pcVar3,bufferSize);
  return this;
}

Assistant:

SimpleString& SimpleString::operator+=(const char* rhs)
{
    size_t originalSize = this->size();
    size_t additionalStringSize = StrLen(rhs) + 1;
    size_t sizeOfNewString = originalSize + additionalStringSize;
    char* tbuffer = copyToNewBuffer(this->getBuffer(), sizeOfNewString);
    StrNCpy(tbuffer + originalSize, rhs, additionalStringSize);

    setInternalBufferTo(tbuffer, sizeOfNewString);
    return *this;
}